

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

Model * addOptionalField(Model *model,string *name)

{
  int iVar1;
  ulong uVar2;
  Rep *pRVar3;
  ModelDescription *pMVar4;
  FeatureDescription *obj;
  void *pvVar5;
  FeatureType *this;
  Int64FeatureType *pIVar6;
  undefined8 *puVar7;
  Arena *pAVar8;
  
  pMVar4 = model->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    uVar2 = (model->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar8);
    model->description_ = pMVar4;
  }
  pRVar3 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar5 = pRVar3->elements[iVar1];
      goto LAB_0013ee63;
    }
  }
  obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                  ((pMVar4->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar4->input_).super_RepeatedPtrFieldBase,obj);
LAB_0013ee63:
  puVar7 = (undefined8 *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)((long)pvVar5 + 0x10),name,puVar7);
  this = *(FeatureType **)((long)pvVar5 + 0x20);
  if (this == (FeatureType *)0x0) {
    pAVar8 = (Arena *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    this = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar8);
    *(FeatureType **)((long)pvVar5 + 0x20) = this;
  }
  if (this->_oneof_case_[0] != 1) {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 1;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pIVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                       (pAVar8);
    (this->Type_).int64type_ = pIVar6;
    this = *(FeatureType **)((long)pvVar5 + 0x20);
    if (this == (FeatureType *)0x0) {
      pAVar8 = (Arena *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      this = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar8)
      ;
      *(FeatureType **)((long)pvVar5 + 0x20) = this;
    }
  }
  this->isoptional_ = true;
  return model;
}

Assistant:

static Specification::Model& addOptionalField(Specification::Model& model, const std::string& name) {
    auto *input = model.mutable_description()->add_input();
    input->set_name(name);
    input->mutable_type()->mutable_int64type();
    input->mutable_type()->set_isoptional(true);
    return model;
}